

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall cfdcapi_psbt_ParsePsbtHex_Test::TestBody(cfdcapi_psbt_ParsePsbtHex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *output;
  char *exp_psbt;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  uint32_t in_stack_000002c8;
  uint32_t in_stack_000002cc;
  char *in_stack_000002d0;
  char *in_stack_000002d8;
  int in_stack_000002e4;
  void *in_stack_000002e8;
  void **in_stack_00000300;
  bool *in_stack_fffffffffffffdd8;
  AssertionResult *in_stack_fffffffffffffde0;
  CfdErrorCode *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  AssertionResult *pAVar3;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  char *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  int result;
  AssertHelper local_178;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100;
  undefined4 local_f4;
  char **in_stack_ffffffffffffff10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff18;
  AssertHelper in_stack_ffffffffffffff20;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff28;
  AssertionResult local_c8;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  result = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x38101a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x38107d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3810d2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(type *)0x381106);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x381202);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x38127d);
  local_9c = 1;
  local_a8 = 0;
  local_b0 = 
  "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
  ;
  local_b8 = (char *)0x0;
  local_14 = CfdCreatePsbtHandle(in_stack_000002e8,in_stack_000002e4,in_stack_000002d8,
                                 in_stack_000002d0,in_stack_000002cc,in_stack_000002c8,
                                 in_stack_00000300);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff28);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x381394);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff20,(Message *)&stack0xffffffffffffff28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff20);
    testing::Message::~Message((Message *)0x3813f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x381449);
  if (local_14 == 0) {
    local_14 = CfdGetPsbtData(in_stack_ffffffffffffff28.ptr_,in_stack_ffffffffffffff20.data_,
                              (char **)in_stack_ffffffffffffff18.ptr_,in_stack_ffffffffffffff10);
    local_f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff10);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x381520);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0xbc,pcVar2);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message((Message *)0x38157d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3815d2);
    if (local_14 == 0) {
      pAVar3 = &local_118;
      testing::internal::CmpHelperSTREQ((internal *)pAVar3,"exp_psbt","output",local_b0,local_b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
      result = (int)((ulong)pAVar3 >> 0x20);
      if (!bVar1) {
        testing::Message::Message(&local_120);
        in_stack_fffffffffffffe18 =
             testing::AssertionResult::failure_message((AssertionResult *)0x381676);
        testing::internal::AssertHelper::AssertHelper
                  (&local_128,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0xbe,in_stack_fffffffffffffe18);
        testing::internal::AssertHelper::operator=(&local_128,&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_128);
        testing::Message::~Message((Message *)0x3816d3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x381728);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffde8);
      local_b8 = (char *)0x0;
    }
    local_14 = CfdFreePsbtHandle((void *)CONCAT44(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98),
                                 in_stack_fffffffffffffe90.ptr_);
    local_13c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x381800);
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0xc4,pcVar2);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      testing::Message::~Message((Message *)0x38185d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3818b2);
  }
  CfdcapiPsbtDumpLog(result,in_stack_fffffffffffffe18);
  local_14 = CfdFreeHandle(in_stack_fffffffffffffde8);
  pAVar3 = &local_160;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),&pAVar3->success_
             ,in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffe90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x38197d);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xc9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&stack0xfffffffffffffe90);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x3819da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x381a2f);
  return;
}

Assistant:

TEST(cfdcapi_psbt, ParsePsbtHex) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt = "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, exp_psbt, "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdGetPsbtData(handle, psbt_handle, nullptr, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }
  CfdcapiPsbtDumpLog(ret, handle);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}